

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O3

shared_ptr<kratos::Var> __thiscall
kratos::Generator::get_auxiliary_var(Generator *this,uint32_t width,bool signed_)

{
  size_type *psVar1;
  unordered_map<unsigned_int,_std::shared_ptr<kratos::Var>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<kratos::Var>_>_>_>
  *this_00;
  pointer ppVar2;
  iterator iVar3;
  undefined7 in_register_00000011;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  undefined4 in_register_00000034;
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_int,_std::shared_ptr<kratos::Var>_>,_false,_false>,_bool>
  pVar5;
  shared_ptr<kratos::Var> sVar6;
  Generator *local_38;
  int local_2c;
  key_type local_28;
  undefined1 local_22;
  bool local_21;
  uint32_t width_local;
  bool signed__local;
  
  local_28 = (key_type)CONCAT71(in_register_00000011,signed_);
  this_00 = &((Generator *)CONCAT44(in_register_00000034,width))->auxiliary_vars_;
  iVar3 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::shared_ptr<kratos::Var>_>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<kratos::Var>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&this_00->_M_h,&local_28);
  if (iVar3.
      super__Node_iterator_base<std::pair<const_unsigned_int,_std::shared_ptr<kratos::Var>_>,_false>
      ._M_cur == (__node_type *)0x0) {
    local_2c = 1;
    local_38 = (Generator *)CONCAT44(in_register_00000034,width);
    std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<std::allocator<kratos::Var>,kratos::Generator*,char_const(&)[1],unsigned_int&,int,bool&>
              ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)this,
               (allocator<kratos::Var> *)&local_22,&local_38,(char (*) [1])0x237290,&local_28,
               &local_2c,&local_21);
    pVar5 = std::
            _Hashtable<unsigned_int,std::pair<unsigned_int_const,std::shared_ptr<kratos::Var>>,std::allocator<std::pair<unsigned_int_const,std::shared_ptr<kratos::Var>>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            ::_M_emplace<unsigned_int&,std::shared_ptr<kratos::Var>&>
                      ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,std::shared_ptr<kratos::Var>>,std::allocator<std::pair<unsigned_int_const,std::shared_ptr<kratos::Var>>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                        *)this_00,&local_28,this);
    _Var4._M_pi = pVar5._8_8_;
  }
  else {
    iVar3 = std::
            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::shared_ptr<kratos::Var>_>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<kratos::Var>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&this_00->_M_h,&local_28);
    if (iVar3.
        super__Node_iterator_base<std::pair<const_unsigned_int,_std::shared_ptr<kratos::Var>_>,_false>
        ._M_cur == (__node_type *)0x0) {
      std::__throw_out_of_range("_Map_base::at");
    }
    (this->super_IRNode)._vptr_IRNode =
         *(_func_int ***)
          ((long)iVar3.
                 super__Node_iterator_base<std::pair<const_unsigned_int,_std::shared_ptr<kratos::Var>_>,_false>
                 ._M_cur + 0x10);
    ppVar2 = *(pointer *)
              ((long)iVar3.
                     super__Node_iterator_base<std::pair<const_unsigned_int,_std::shared_ptr<kratos::Var>_>,_false>
                     ._M_cur + 0x18);
    (this->super_IRNode).fn_name_ln.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start = ppVar2;
    _Var4._M_pi = extraout_RDX;
    if (ppVar2 != (pointer)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        psVar1 = &(ppVar2->first)._M_string_length;
        *(int *)psVar1 = (int)*psVar1 + 1;
        UNLOCK();
      }
      else {
        psVar1 = &(ppVar2->first)._M_string_length;
        *(int *)psVar1 = (int)*psVar1 + 1;
      }
    }
  }
  sVar6.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var4._M_pi;
  sVar6.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<kratos::Var>)sVar6.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Var> Generator::get_auxiliary_var(uint32_t width, bool signed_) {
    if (auxiliary_vars_.find(width) != auxiliary_vars_.end()) {
        return auxiliary_vars_.at(width);
    }
    auto v = std::make_shared<Var>(this, "", width, 1, signed_);
    auxiliary_vars_.emplace(width, v);
    return v;
}